

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

void __thiscall
QTouchEvent::QTouchEvent
          (QTouchEvent *this,Type eventType,QPointingDevice *device,KeyboardModifiers modifiers,
          QList<QEventPoint> *touchPoints)

{
  bool bVar1;
  State other;
  iterator o;
  QPointerEvent *in_RDX;
  KeyboardModifiers in_ESI;
  QList<QEventPoint> *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QEventPoint *point;
  QList<QEventPoint> *__range1;
  iterator __end1;
  iterator __begin1;
  undefined7 in_stack_ffffffffffffff98;
  State in_stack_ffffffffffffff9f;
  QList<QEventPoint> *in_stack_ffffffffffffffa8;
  QPointingDevice *in_stack_ffffffffffffffb0;
  iterator local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPointerEvent::QPointerEvent
            (in_RDX,(Type)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffffb0,in_ESI,
             in_stack_ffffffffffffffa8);
  *(undefined ***)&(in_RDI->d).d = &PTR__QTouchEvent_00e15e28;
  in_RDI[2].d.size = 0;
  QFlags<QEventPoint::State>::QFlags((QFlags<QEventPoint::State> *)in_RDI,in_stack_ffffffffffffff9f)
  ;
  local_18[0].i = (QEventPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_18[0] = QList<QEventPoint>::begin(in_RDI);
  o = QList<QEventPoint>::end(in_RDI);
  while( true ) {
    bVar1 = QList<QEventPoint>::iterator::operator!=(local_18,o);
    if (!bVar1) break;
    QList<QEventPoint>::iterator::operator*(local_18);
    other = QEventPoint::state((QEventPoint *)in_RDI);
    QFlags<QEventPoint::State>::operator|=((QFlags<QEventPoint::State> *)(in_RDI + 3),other);
    QMutableEventPoint::setDevice
              ((QEventPoint *)in_RDI,
               (QPointingDevice *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    QList<QEventPoint>::iterator::operator++(local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTouchEvent::QTouchEvent(QEvent::Type eventType,
                         const QPointingDevice *device,
                         Qt::KeyboardModifiers modifiers,
                         const QList<QEventPoint> &touchPoints)
    : QPointerEvent(eventType, device, modifiers, touchPoints),
      m_target(nullptr)
{
    for (QEventPoint &point : m_points) {
        m_touchPointStates |= point.state();
        QMutableEventPoint::setDevice(point, device);
    }
}